

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCompression.cpp
# Opt level: O3

void Imf_3_4::getCompressionNamesString(string *separator,string *str)

{
  long lVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  lVar1 = 0;
  do {
    std::operator+(&local_50,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (IdToDesc + lVar1),separator);
    std::__cxx11::string::_M_append((char *)str,(ulong)local_50._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    lVar1 = lVar1 + 0x48;
  } while (lVar1 != 0x288);
  std::__cxx11::string::_M_append((char *)str,IdToDesc._648_8_);
  return;
}

Assistant:

void
getCompressionNamesString (const std::string& separator, std::string& str)
{
    int i = 0;
    for (; i < static_cast<int> (NUM_COMPRESSION_METHODS) - 1; i++)
    {
        str += IdToDesc[i].name + separator;
    }
    str += IdToDesc[i].name;
}